

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void double_conversion::BignumDtoa
               (double v,BignumDtoaMode mode,int requested_digits,Vector<char> buffer,int *length,
               int *decimal_point)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  uint32_t uVar1;
  char *pcVar2;
  int *in_RDX;
  int in_ESI;
  uint in_EDI;
  int *in_R8;
  int *in_R9;
  double in_XMM0_Qa;
  Bignum delta_plus;
  Bignum delta_minus;
  Bignum denominator;
  Bignum numerator;
  int estimated_power;
  int normalized_exponent;
  bool is_even;
  bool need_boundary_deltas;
  float f;
  bool lower_boundary_is_closer;
  int exponent;
  uint64_t significand;
  double in_stack_fffffffffffff6f8;
  float f_00;
  Double *in_stack_fffffffffffff700;
  Bignum *this;
  Double *in_stack_fffffffffffff708;
  Bignum *this_00;
  undefined4 in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  Bignum *delta_plus_00;
  Bignum *this_01;
  Bignum *this_02;
  Bignum *delta_plus_01;
  int requested_digits_00;
  undefined4 in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  undefined4 uVar3;
  Bignum *in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  Bignum local_88c;
  Bignum local_688;
  Bignum local_484;
  Bignum local_280;
  int local_7c;
  int local_78;
  undefined1 local_72;
  undefined1 local_71;
  float local_4c;
  bool local_45;
  int local_44;
  ulong local_40;
  int *local_38;
  int *local_30;
  int local_28;
  uint local_24;
  Vector<char> local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_ESI;
  local_24 = in_EDI;
  local_18.start_ = (char *)in_RDX;
  if (in_EDI == 1) {
    local_4c = (float)in_XMM0_Qa;
    Single::Single((Single *)in_stack_fffffffffffff700,
                   (float)((ulong)in_stack_fffffffffffff6f8 >> 0x20));
    f_00 = (float)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
    uVar1 = Single::Significand((Single *)in_stack_fffffffffffff708);
    local_40 = (ulong)uVar1;
    Single::Single((Single *)in_stack_fffffffffffff700,f_00);
    local_44 = Single::Exponent((Single *)in_stack_fffffffffffff708);
    Single::Single((Single *)in_stack_fffffffffffff700,f_00);
    local_45 = Single::LowerBoundaryIsCloser((Single *)in_stack_fffffffffffff700);
  }
  else {
    Double::Double(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
    local_40 = Double::Significand(in_stack_fffffffffffff708);
    Double::Double(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
    local_44 = Double::Exponent(in_stack_fffffffffffff708);
    Double::Double(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
    local_45 = Double::LowerBoundaryIsCloser(in_stack_fffffffffffff700);
  }
  uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffff73c);
  if (local_24 != 0) {
    uVar3 = CONCAT13(local_24 == 1,(int3)in_stack_fffffffffffff73c);
  }
  local_71 = (undefined1)((uint)uVar3 >> 0x18);
  local_72 = (local_40 & 1) == 0;
  local_78 = NormalizedExponent(local_40,local_44);
  local_7c = EstimatePower(in_stack_fffffffffffff714);
  if ((local_24 == 2) && (local_28 < -1 - local_7c)) {
    pcVar2 = Vector<char>::operator[](&local_18,0);
    *pcVar2 = '\0';
    *local_30 = 0;
    *local_38 = -local_28;
  }
  else {
    this_01 = &local_280;
    Bignum::Bignum(this_01);
    this_02 = &local_484;
    Bignum::Bignum(this_02);
    this = &local_688;
    Bignum::Bignum(this);
    this_00 = &local_88c;
    delta_plus_00 = this_00;
    Bignum::Bignum(this_00);
    delta_plus_01 = this;
    InitialScaledStartValues
              ((uint64_t)this_01,(int)((ulong)delta_plus_00 >> 0x20),
               SUB81((ulong)delta_plus_00 >> 0x18,0),in_stack_fffffffffffff714,
               SUB41((uint)in_stack_fffffffffffff710 >> 0x18,0),this_00,this,
               (Bignum *)CONCAT44(uVar3,in_stack_fffffffffffff738),in_stack_fffffffffffff740);
    FixupMultiply10((int)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0),
                    (int *)delta_plus_00,
                    (Bignum *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),this_00,
                    this,delta_plus_01);
    requested_digits_00 = (int)((ulong)delta_plus_01 >> 0x20);
    if (local_24 < 2) {
      buffer_02._8_8_ = in_stack_fffffffffffff748;
      buffer_02.start_ = (char *)in_stack_fffffffffffff740;
      GenerateShortestDigits
                (delta_plus_01,this_02,this_01,delta_plus_00,
                 SUB41((uint)in_stack_fffffffffffff714 >> 0x18,0),buffer_02,(int *)this_00);
    }
    else if (local_24 == 2) {
      buffer_01.start_._4_4_ = uVar3;
      buffer_01.start_._0_4_ = 2;
      buffer_01._8_8_ = in_stack_fffffffffffff740;
      BignumToFixed(requested_digits_00,(int *)this_02,this_01,delta_plus_00,buffer_01,
                    (int *)local_18.start_);
    }
    else {
      if (local_24 != 3) {
        abort();
      }
      buffer_00.length_ = (int)delta_plus_01;
      buffer_00.start_ = (char *)this_02;
      buffer_00._12_4_ = requested_digits_00;
      GenerateCountedDigits
                ((int)((ulong)this_01 >> 0x20),(int *)delta_plus_00,
                 (Bignum *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),this_00,
                 buffer_00,(int *)local_18.start_);
    }
    pcVar2 = Vector<char>::operator[](&local_18,*local_30);
    *pcVar2 = '\0';
  }
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  DOUBLE_CONVERSION_ASSERT(v > 0);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    DOUBLE_CONVERSION_ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  DOUBLE_CONVERSION_ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  buffer[*length] = '\0';
}